

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<kj::Promise<void>_>::Maybe
          (Maybe<kj::Promise<void>_> *this,Maybe<kj::Promise<void>_> *other)

{
  NullableValue<kj::Promise<void>_> *other_00;
  Maybe<kj::Promise<void>_> *other_local;
  Maybe<kj::Promise<void>_> *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::Promise<void>>>(&other->ptr);
  kj::_::NullableValue<kj::Promise<void>_>::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }